

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixShmMap(sqlite3_file *fd,int iRegion,int szRegion,int bExtend,void **pp)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  undefined8 uVar6;
  void *local_118;
  void *pMem;
  int i;
  int nMap;
  char *zFile;
  int x;
  int iPg;
  stat sStat;
  int nByte;
  char **apNew;
  int nReqRegion;
  int nShmPerMap;
  int rc;
  unixShmNode *pShmNode;
  unixShm *p;
  unixFile *pDbFd;
  void **pp_local;
  int bExtend_local;
  int szRegion_local;
  int iRegion_local;
  sqlite3_file *fd_local;
  
  nReqRegion = 0;
  iVar2 = unixShmRegionPerMap();
  if ((fd[8].pMethods == (sqlite3_io_methods *)0x0) &&
     (nReqRegion = unixOpenSharedMemory((unixFile *)fd), nReqRegion != 0)) {
    return nReqRegion;
  }
  lVar1 = *(long *)fd[8].pMethods;
  sqlite3_mutex_enter(*(sqlite3_mutex **)(lVar1 + 8));
  iVar3 = ((iRegion + iVar2) / iVar2) * iVar2;
  if ((int)(uint)*(ushort *)(lVar1 + 0x20) < iVar3) {
    sStat.__glibc_reserved[2]._4_4_ = iVar3 * szRegion;
    *(int *)(lVar1 + 0x1c) = szRegion;
    if (-1 < *(int *)(lVar1 + 0x18)) {
      iVar4 = (*aSyscall[5].pCurrent)
                        ((ulong)*(uint *)(lVar1 + 0x18),&x,
                         (long)(iRegion + iVar2) % (long)iVar2 & 0xffffffff);
      if (iVar4 != 0) {
        nReqRegion = 0x130a;
        goto LAB_003ec835;
      }
      if ((long)sStat.st_rdev < (long)sStat.__glibc_reserved[2]._4_4_) {
        if (bExtend == 0) goto LAB_003ec835;
        for (zFile._4_4_ = (int)((long)sStat.st_rdev / 0x1000);
            zFile._4_4_ < sStat.__glibc_reserved[2]._4_4_ / 0x1000; zFile._4_4_ = zFile._4_4_ + 1) {
          zFile._0_4_ = 0;
          iVar4 = seekAndWriteFd(*(int *)(lVar1 + 0x18),(long)(zFile._4_4_ * 0x1000 + 0xfff),"",1,
                                 (int *)&zFile);
          if (iVar4 != 1) {
            nReqRegion = unixLogErrorAtLine(0x130a,"write",*(char **)(lVar1 + 0x10),0x8840);
            goto LAB_003ec835;
          }
        }
      }
    }
    pvVar5 = sqlite3_realloc(*(void **)(lVar1 + 0x28),iVar3 * 8);
    if (pvVar5 == (void *)0x0) {
      nReqRegion = 0xc0a;
    }
    else {
      *(void **)(lVar1 + 0x28) = pvVar5;
      while ((int)(uint)*(ushort *)(lVar1 + 0x20) < iVar3) {
        if (*(int *)(lVar1 + 0x18) < 0) {
          local_118 = sqlite3_malloc64((long)szRegion);
          if (local_118 == (void *)0x0) {
            nReqRegion = 7;
            break;
          }
          memset(local_118,0,(long)szRegion);
        }
        else {
          uVar6 = 3;
          if (*(char *)(lVar1 + 0x22) != '\0') {
            uVar6 = 1;
          }
          local_118 = (void *)(*aSyscall[0x16].pCurrent)
                                        (0,(long)(szRegion * iVar2),uVar6,1,
                                         (ulong)*(uint *)(lVar1 + 0x18),
                                         (long)szRegion * (ulong)*(ushort *)(lVar1 + 0x20));
          if (local_118 == (void *)0xffffffffffffffff) {
            nReqRegion = unixLogErrorAtLine(0x150a,"mmap",*(char **)(lVar1 + 0x10),0x885b);
            break;
          }
        }
        for (pMem._0_4_ = 0; (int)pMem < iVar2; pMem._0_4_ = (int)pMem + 1) {
          *(long *)(*(long *)(lVar1 + 0x28) +
                   (long)(int)((uint)*(ushort *)(lVar1 + 0x20) + (int)pMem) * 8) =
               (long)local_118 + (long)(szRegion * (int)pMem);
        }
        *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + (short)iVar2;
      }
    }
  }
LAB_003ec835:
  if (iRegion < (int)(uint)*(ushort *)(lVar1 + 0x20)) {
    *pp = *(void **)(*(long *)(lVar1 + 0x28) + (long)iRegion * 8);
  }
  else {
    *pp = (void *)0x0;
  }
  if ((*(char *)(lVar1 + 0x22) != '\0') && (nReqRegion == 0)) {
    nReqRegion = 8;
  }
  sqlite3_mutex_leave(*(sqlite3_mutex **)(lVar1 + 8));
  return nReqRegion;
}

Assistant:

static int unixShmMap(
  sqlite3_file *fd,               /* Handle open on database file */
  int iRegion,                    /* Region to retrieve */
  int szRegion,                   /* Size of regions */
  int bExtend,                    /* True to extend file if necessary */
  void volatile **pp              /* OUT: Mapped memory */
){
  unixFile *pDbFd = (unixFile*)fd;
  unixShm *p;
  unixShmNode *pShmNode;
  int rc = SQLITE_OK;
  int nShmPerMap = unixShmRegionPerMap();
  int nReqRegion;

  /* If the shared-memory file has not yet been opened, open it now. */
  if( pDbFd->pShm==0 ){
    rc = unixOpenSharedMemory(pDbFd);
    if( rc!=SQLITE_OK ) return rc;
  }

  p = pDbFd->pShm;
  pShmNode = p->pShmNode;
  sqlite3_mutex_enter(pShmNode->mutex);
  assert( szRegion==pShmNode->szRegion || pShmNode->nRegion==0 );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( pShmNode->h>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->h<0 || pDbFd->pInode->bProcessLock==0 );

  /* Minimum number of regions required to be mapped. */
  nReqRegion = ((iRegion+nShmPerMap) / nShmPerMap) * nShmPerMap;

  if( pShmNode->nRegion<nReqRegion ){
    char **apNew;                      /* New apRegion[] array */
    int nByte = nReqRegion*szRegion;   /* Minimum required file size */
    struct stat sStat;                 /* Used by fstat() */

    pShmNode->szRegion = szRegion;

    if( pShmNode->h>=0 ){
      /* The requested region is not mapped into this processes address space.
      ** Check to see if it has been allocated (i.e. if the wal-index file is
      ** large enough to contain the requested region).
      */
      if( osFstat(pShmNode->h, &sStat) ){
        rc = SQLITE_IOERR_SHMSIZE;
        goto shmpage_out;
      }
  
      if( sStat.st_size<nByte ){
        /* The requested memory region does not exist. If bExtend is set to
        ** false, exit early. *pp will be set to NULL and SQLITE_OK returned.
        */
        if( !bExtend ){
          goto shmpage_out;
        }

        /* Alternatively, if bExtend is true, extend the file. Do this by
        ** writing a single byte to the end of each (OS) page being
        ** allocated or extended. Technically, we need only write to the
        ** last page in order to extend the file. But writing to all new
        ** pages forces the OS to allocate them immediately, which reduces
        ** the chances of SIGBUS while accessing the mapped region later on.
        */
        else{
          static const int pgsz = 4096;
          int iPg;

          /* Write to the last byte of each newly allocated or extended page */
          assert( (nByte % pgsz)==0 );
          for(iPg=(sStat.st_size/pgsz); iPg<(nByte/pgsz); iPg++){
            int x = 0;
            if( seekAndWriteFd(pShmNode->h, iPg*pgsz + pgsz-1, "", 1, &x)!=1 ){
              const char *zFile = pShmNode->zFilename;
              rc = unixLogError(SQLITE_IOERR_SHMSIZE, "write", zFile);
              goto shmpage_out;
            }
          }
        }
      }
    }

    /* Map the requested memory region into this processes address space. */
    apNew = (char **)sqlite3_realloc(
        pShmNode->apRegion, nReqRegion*sizeof(char *)
    );
    if( !apNew ){
      rc = SQLITE_IOERR_NOMEM_BKPT;
      goto shmpage_out;
    }
    pShmNode->apRegion = apNew;
    while( pShmNode->nRegion<nReqRegion ){
      int nMap = szRegion*nShmPerMap;
      int i;
      void *pMem;
      if( pShmNode->h>=0 ){
        pMem = osMmap(0, nMap,
            pShmNode->isReadonly ? PROT_READ : PROT_READ|PROT_WRITE, 
            MAP_SHARED, pShmNode->h, szRegion*(i64)pShmNode->nRegion
        );
        if( pMem==MAP_FAILED ){
          rc = unixLogError(SQLITE_IOERR_SHMMAP, "mmap", pShmNode->zFilename);
          goto shmpage_out;
        }
      }else{
        pMem = sqlite3_malloc64(szRegion);
        if( pMem==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto shmpage_out;
        }
        memset(pMem, 0, szRegion);
      }

      for(i=0; i<nShmPerMap; i++){
        pShmNode->apRegion[pShmNode->nRegion+i] = &((char*)pMem)[szRegion*i];
      }
      pShmNode->nRegion += nShmPerMap;
    }
  }

shmpage_out:
  if( pShmNode->nRegion>iRegion ){
    *pp = pShmNode->apRegion[iRegion];
  }else{
    *pp = 0;
  }
  if( pShmNode->isReadonly && rc==SQLITE_OK ) rc = SQLITE_READONLY;
  sqlite3_mutex_leave(pShmNode->mutex);
  return rc;
}